

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

size_t mg_handle_chunked(mg_connection *nc,http_message *hm,char *buf,size_t blen)

{
  bool bVar1;
  char *pcVar2;
  size_t zero_chunk_received;
  size_t body_len;
  size_t data_len;
  size_t n;
  size_t i;
  char *data;
  proto_data_http *dp;
  size_t blen_local;
  char *buf_local;
  http_message *hm_local;
  mg_connection *nc_local;
  
  bVar1 = false;
  dp = (proto_data_http *)blen;
  blen_local = (size_t)buf;
  buf_local = (char *)hm;
  hm_local = (http_message *)nc;
  if (nc->proto_data == (void *)0x0) {
    pcVar2 = (char *)calloc(1,0x30);
    hm_local->header_names[3].p = pcVar2;
    if (pcVar2 == (char *)0x0) {
      hm_local->header_names[6].p = (char *)((ulong)hm_local->header_names[6].p | 0x800);
      return 0;
    }
  }
  data = hm_local->header_names[3].p;
  zero_chunk_received = *(size_t *)(data + 0x18);
  n = zero_chunk_received;
  if (dp < zero_chunk_received) {
    __assert_fail("blen >= body_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                  ,0x11d6,
                  "size_t mg_handle_chunked(struct mg_connection *, struct http_message *, char *, size_t)"
                 );
  }
  do {
    data_len = parse_chunk((char *)(blen_local + n),(long)dp - n,(char **)&i,&body_len);
    if (data_len == 0) {
LAB_00111129:
      if (zero_chunk_received < n) {
        if (dp < n) {
          __assert_fail("i <= blen",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                        ,0x11e9,
                        "size_t mg_handle_chunked(struct mg_connection *, struct http_message *, char *, size_t)"
                       );
        }
        memmove((void *)(blen_local + zero_chunk_received),(void *)(blen_local + n),(long)dp - n);
        memset((void *)((long)dp + ((blen_local + zero_chunk_received) - n)),0,
               n - zero_chunk_received);
        (hm_local->resp_status_msg).p = (hm_local->resp_status_msg).p + -(n - zero_chunk_received);
        *(size_t *)(data + 0x18) = zero_chunk_received;
        hm_local->header_names[6].p =
             (char *)((ulong)hm_local->header_names[6].p & 0xffffffffffffdfff);
        mg_call((mg_connection *)hm_local,(mg_event_handler_t)hm_local->header_names[3].len,0x66,
                buf_local);
        if (((ulong)hm_local->header_names[6].p & 0x2000) != 0) {
          memset((void *)blen_local,0,zero_chunk_received);
          memmove((void *)blen_local,(void *)(blen_local + zero_chunk_received),(long)dp - n);
          (hm_local->resp_status_msg).p = (hm_local->resp_status_msg).p + -zero_chunk_received;
          data[0x18] = '\0';
          data[0x19] = '\0';
          data[0x1a] = '\0';
          data[0x1b] = '\0';
          data[0x1c] = '\0';
          data[0x1d] = '\0';
          data[0x1e] = '\0';
          data[0x1f] = '\0';
          buf_local[0x570] = '\0';
          buf_local[0x571] = '\0';
          buf_local[0x572] = '\0';
          buf_local[0x573] = '\0';
          buf_local[0x574] = '\0';
          buf_local[0x575] = '\0';
          buf_local[0x576] = '\0';
          buf_local[0x577] = '\0';
        }
        if (bVar1) {
          *(size_t *)(buf_local + 8) = (long)dp + (*(long *)(data + 0x18) - n);
        }
      }
      return zero_chunk_received;
    }
    memmove((void *)(blen_local + zero_chunk_received),(void *)i,body_len);
    zero_chunk_received = body_len + zero_chunk_received;
    *(size_t *)(buf_local + 0x570) = zero_chunk_received;
    if (body_len == 0) {
      bVar1 = true;
      n = data_len + n;
      goto LAB_00111129;
    }
    n = data_len + n;
  } while( true );
}

Assistant:

MG_INTERNAL size_t mg_handle_chunked(struct mg_connection *nc,
                                     struct http_message *hm, char *buf,
                                     size_t blen) {
    struct proto_data_http *dp;
    char *data;
    size_t i, n, data_len, body_len, zero_chunk_received = 0;

    /* If not allocated, allocate proto_data to hold reassembled offset */
    if (nc->proto_data == NULL &&
        (nc->proto_data = MG_CALLOC(1, sizeof(*dp))) == NULL) {
        nc->flags |= MG_F_CLOSE_IMMEDIATELY;
        return 0;
    }

    /* Find out piece of received data that is not yet reassembled */
    dp = (struct proto_data_http *) nc->proto_data;
    body_len = dp->body_len;
    assert(blen >= body_len);

    /* Traverse all fully buffered chunks */
    for (i = body_len; (n = parse_chunk(buf + i, blen - i, &data, &data_len)) > 0;
         i += n) {
        /* Collapse chunk data to the rest of HTTP body */
        memmove(buf + body_len, data, data_len);
        body_len += data_len;
        hm->body.len = body_len;

        if (data_len == 0) {
            zero_chunk_received = 1;
            i += n;
            break;
        }
    }

    if (i > body_len) {
        /* Shift unparsed content to the parsed body */
        assert(i <= blen);
        memmove(buf + body_len, buf + i, blen - i);
        memset(buf + body_len + blen - i, 0, i - body_len);
        nc->recv_mbuf.len -= i - body_len;
        dp->body_len = body_len;

        /* Send MG_EV_HTTP_CHUNK event */
        nc->flags &= ~MG_F_DELETE_CHUNK;
        mg_call(nc, nc->handler, MG_EV_HTTP_CHUNK, hm);

        /* Delete processed data if user set MG_F_DELETE_CHUNK flag */
        if (nc->flags & MG_F_DELETE_CHUNK) {
            memset(buf, 0, body_len);
            memmove(buf, buf + body_len, blen - i);
            nc->recv_mbuf.len -= body_len;
            hm->body.len = dp->body_len = 0;
        }

        if (zero_chunk_received) {
            hm->message.len = dp->body_len + blen - i;
        }
    }

    return body_len;
}